

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::timestamp_t,duckdb::timestamp_t),false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,
               _func_timestamp_t_timestamp_t_timestamp_t *fun)

{
  bool bVar1;
  timestamp_t *count_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  Vector *in_RDX;
  TemplatedValidityMask<unsigned_long> *in_R8;
  ValidityMask *result_validity;
  timestamp_t *result_data;
  timestamp_t *rdata;
  timestamp_t *ldata;
  _func_timestamp_t_timestamp_t_timestamp_t *in_stack_00000058;
  ValidityMask *in_stack_00000060;
  idx_t in_stack_00000068;
  timestamp_t *in_stack_00000070;
  timestamp_t *in_stack_00000078;
  timestamp_t *in_stack_00000080;
  Vector *in_stack_ffffffffffffffb0;
  
  count_00 = FlatVector::GetData<duckdb::timestamp_t>((Vector *)0x50b2d7);
  FlatVector::GetData<duckdb::timestamp_t>((Vector *)0x50b2e6);
  bVar1 = ConstantVector::IsNull((Vector *)0x50b2f5);
  if (bVar1) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    duckdb::ConstantVector::SetNull(in_RDX,true);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    FlatVector::GetData<duckdb::timestamp_t>((Vector *)0x50b334);
    FlatVector::Validity((Vector *)0x50b343);
    bVar1 = BinaryLambdaWrapper::AddsNulls();
    if (bVar1) {
      FlatVector::Validity((Vector *)0x50b367);
      TemplatedValidityMask<unsigned_long>::Copy(in_RCX,in_R8,(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0x50b38e);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,(ValidityMask *)in_RDX);
    }
    ExecuteFlatLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::timestamp_t,duckdb::timestamp_t),false,true>
              (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}